

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_list_prefix_expr(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos763;
  int yypos763;
  int yythunkpos762;
  int yypos762;
  int yythunkpos760;
  int yypos760;
  int yythunkpos758;
  int yypos758;
  int yythunkpos757;
  int yypos757;
  int yythunkpos754;
  int yypos754;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,4,0,"yyPush");
  iVar6 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yymatchChar(G,0x5b);
  if ((iVar5 != 0) && (iVar5 = yy_reduce_operator(G), iVar5 != 0)) {
    yyDo(G,yySet,-4,0,"yySet");
    iVar5 = yymatchChar(G,0x5d);
    if ((iVar5 != 0) &&
       ((iVar5 = yy__(G), iVar5 != 0 && (iVar5 = yy_list_infix_expr(G), iVar5 != 0)))) {
      yyDo(G,yySet,-3,0,"yySet");
      yyDo(G,yy_1_list_prefix_expr,G->begin,G->end,"yy_1_list_prefix_expr");
      goto LAB_00124e70;
    }
  }
  G->pos = iVar6;
  G->thunkpos = iVar3;
  iVar6 = yy_list_infix_expr(G);
  if (iVar6 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    return 0;
  }
  yyDo(G,yySet,-2,0,"yySet");
  yyDo(G,yy_2_list_prefix_expr,G->begin,G->end,"yy_2_list_prefix_expr");
LAB_00124b92:
  do {
    iVar1 = G->pos;
    iVar2 = G->thunkpos;
    iVar6 = G->pos;
    iVar3 = G->thunkpos;
    iVar5 = yy__(G);
    if ((iVar5 != 0) && (iVar5 = yymatchChar(G,0x3d), iVar5 != 0)) {
      iVar5 = G->pos;
      iVar4 = G->thunkpos;
      iVar7 = yymatchChar(G,0x3d);
      if (iVar7 == 0) {
        G->pos = iVar5;
        G->thunkpos = iVar4;
        iVar5 = yy__(G);
        if ((iVar5 != 0) && (iVar5 = yy_list_prefix_expr(G), iVar5 != 0)) {
          yyDo(G,yySet,-1,0,"yySet");
          yyDo(G,yy_3_list_prefix_expr,G->begin,G->end,"yy_3_list_prefix_expr");
          goto LAB_00124b92;
        }
      }
    }
    G->pos = iVar6;
    G->thunkpos = iVar3;
    iVar5 = yy__(G);
    if ((iVar5 == 0) || (iVar5 = yymatchString(G,":="), iVar5 == 0)) {
LAB_00124d74:
      G->pos = iVar6;
      G->thunkpos = iVar3;
      iVar6 = yy__(G);
      if ((iVar6 == 0) || (iVar6 = yymatchString(G,"::="), iVar6 == 0)) break;
      iVar6 = G->pos;
      iVar3 = G->thunkpos;
      iVar5 = yymatchChar(G,0x3d);
      if (iVar5 != 0) break;
      G->pos = iVar6;
      G->thunkpos = iVar3;
      iVar6 = yy__(G);
      if ((iVar6 == 0) || (iVar6 = yy_list_prefix_expr(G), iVar6 == 0)) break;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_5_list_prefix_expr,G->begin,G->end,"yy_5_list_prefix_expr");
    }
    else {
      iVar5 = G->pos;
      iVar4 = G->thunkpos;
      iVar7 = yymatchChar(G,0x3d);
      if (iVar7 != 0) goto LAB_00124d74;
      G->pos = iVar5;
      G->thunkpos = iVar4;
      iVar5 = yy__(G);
      if ((iVar5 == 0) || (iVar5 = yy_list_prefix_expr(G), iVar5 == 0)) goto LAB_00124d74;
      yyDo(G,yySet,-1,0,"yySet");
      yyDo(G,yy_4_list_prefix_expr,G->begin,G->end,"yy_4_list_prefix_expr");
    }
  } while( true );
  G->pos = iVar1;
  G->thunkpos = iVar2;
LAB_00124e70:
  yyDo(G,yyPop,4,0,"yyPop");
  return 1;
}

Assistant:

YY_RULE(int) yy_list_prefix_expr(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 4, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "list_prefix_expr"));

  {  int yypos754= G->pos, yythunkpos754= G->thunkpos;  if (!yymatchChar(G, '[')) goto l755;
  if (!yy_reduce_operator(G))  goto l755;
  yyDo(G, yySet, -4, 0, "yySet");
  if (!yymatchChar(G, ']')) goto l755;
  if (!yy__(G))  goto l755;
  if (!yy_list_infix_expr(G))  goto l755;
  yyDo(G, yySet, -3, 0, "yySet");
  yyDo(G, yy_1_list_prefix_expr, G->begin, G->end, "yy_1_list_prefix_expr");
  goto l754;
  l755:;	  G->pos= yypos754; G->thunkpos= yythunkpos754;  if (!yy_list_infix_expr(G))  goto l753;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_2_list_prefix_expr, G->begin, G->end, "yy_2_list_prefix_expr");

  l756:;	
  {  int yypos757= G->pos, yythunkpos757= G->thunkpos;
  {  int yypos758= G->pos, yythunkpos758= G->thunkpos;  if (!yy__(G))  goto l759;
  if (!yymatchChar(G, '=')) goto l759;

  {  int yypos760= G->pos, yythunkpos760= G->thunkpos;  if (!yymatchChar(G, '=')) goto l760;
  goto l759;
  l760:;	  G->pos= yypos760; G->thunkpos= yythunkpos760;
  }  if (!yy__(G))  goto l759;
  if (!yy_list_prefix_expr(G))  goto l759;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_3_list_prefix_expr, G->begin, G->end, "yy_3_list_prefix_expr");
  goto l758;
  l759:;	  G->pos= yypos758; G->thunkpos= yythunkpos758;  if (!yy__(G))  goto l761;
  if (!yymatchString(G, ":=")) goto l761;

  {  int yypos762= G->pos, yythunkpos762= G->thunkpos;  if (!yymatchChar(G, '=')) goto l762;
  goto l761;
  l762:;	  G->pos= yypos762; G->thunkpos= yythunkpos762;
  }  if (!yy__(G))  goto l761;
  if (!yy_list_prefix_expr(G))  goto l761;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_4_list_prefix_expr, G->begin, G->end, "yy_4_list_prefix_expr");
  goto l758;
  l761:;	  G->pos= yypos758; G->thunkpos= yythunkpos758;  if (!yy__(G))  goto l757;
  if (!yymatchString(G, "::=")) goto l757;

  {  int yypos763= G->pos, yythunkpos763= G->thunkpos;  if (!yymatchChar(G, '=')) goto l763;
  goto l757;
  l763:;	  G->pos= yypos763; G->thunkpos= yythunkpos763;
  }  if (!yy__(G))  goto l757;
  if (!yy_list_prefix_expr(G))  goto l757;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_5_list_prefix_expr, G->begin, G->end, "yy_5_list_prefix_expr");

  }
  l758:;	  goto l756;
  l757:;	  G->pos= yypos757; G->thunkpos= yythunkpos757;
  }
  }
  l754:;	  yyprintf((stderr, "  ok   list_prefix_expr"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 4, 0, "yyPop");
  return 1;
  l753:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "list_prefix_expr"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}